

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

double __thiscall soplex::SSVectorBase<double>::length2(SSVectorBase<double> *this)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  SSVectorBase<double> *in_RDI;
  int i;
  double x;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  bVar2 = isSetup(in_RDI);
  if (bVar2) {
    for (local_14 = 0; local_14 < (in_RDI->super_IdxSet).num; local_14 = local_14 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,
                          (long)(in_RDI->super_IdxSet).idx[local_14]);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,
                          (long)(in_RDI->super_IdxSet).idx[local_14]);
      local_10 = dVar1 * *pvVar3 + local_10;
    }
  }
  else {
    local_10 = VectorBase<double>::length2((VectorBase<double> *)0x247dea);
  }
  return local_10;
}

Assistant:

R length2() const
   {
      R x = 0;

      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            x += VectorBase<R>::val[idx[i]] * VectorBase<R>::val[idx[i]];
      }
      else
         x = VectorBase<R>::length2();

      return x;
   }